

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  undefined8 uVar1;
  bool bVar2;
  UnconnectedDriveDirectiveSyntax *syntax;
  Preprocessor *in_RDI;
  Token TVar3;
  UnconnectedDriveDirectiveSyntax *result;
  SourceLocation loc;
  Token strength;
  TokenKind in_stack_00000206;
  BumpAllocator *in_stack_00000208;
  SourceLocation in_stack_00000210;
  SourceLocation in_stack_ffffffffffffff48;
  Preprocessor *in_stack_ffffffffffffff50;
  DiagCode code;
  Token in_stack_ffffffffffffff58;
  Token *args_1;
  SourceLocation in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  string_view local_88;
  SourceLocation local_78;
  SourceLocation local_70;
  Token local_68;
  Token local_58;
  undefined8 local_48;
  Token *local_40;
  Token local_20;
  Trivia local_10;
  
  args_1 = (Token *)in_stack_ffffffffffffff58.info;
  checkOutsideDesignElement(in_stack_ffffffffffffff50,in_stack_ffffffffffffff58);
  Token::Token((Token *)in_RDI);
  local_58 = peek((Preprocessor *)in_stack_ffffffffffffff48);
  if (local_58.kind == Pull0Keyword || local_58.kind == Pull1Keyword) {
    TVar3 = consume(in_stack_ffffffffffffff50);
    local_68._0_8_ = TVar3._0_8_;
    local_48._0_2_ = local_68.kind;
    local_48._2_1_ = local_68._2_1_;
    local_48._3_1_ = local_68.numFlags.raw;
    local_48._4_4_ = local_68.rawLen;
    uVar1 = local_48;
    local_68.info = TVar3.info;
    local_40 = (Token *)local_68.info;
    local_48._0_2_ = TVar3.kind;
    in_RDI->unconnectedDrive = (TokenKind)local_48;
    local_68 = TVar3;
    local_48 = uVar1;
  }
  bVar2 = Token::operator_cast_to_bool((Token *)0x2bd219);
  if (!bVar2) {
    local_78 = Token::location(&local_20);
    local_88 = Token::rawText((Token *)in_stack_ffffffffffffff50);
    code = SUB84((ulong)in_stack_ffffffffffffff50 >> 0x20,0);
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_88);
    in_stack_ffffffffffffff68 =
         SourceLocation::operator+<unsigned_long>
                   ((SourceLocation *)in_stack_ffffffffffffff48,(unsigned_long)in_RDI);
    in_stack_ffffffffffffff74 = 0x30004;
    local_70 = in_stack_ffffffffffffff68;
    addDiag(in_RDI,code,in_stack_ffffffffffffff48);
    TVar3 = Token::createMissing(in_stack_00000208,in_stack_00000206,in_stack_00000210);
    local_48 = TVar3._0_8_;
    local_40 = (Token *)TVar3.info;
    args_1 = local_40;
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     ((BumpAllocator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                      ,(Token *)in_stack_ffffffffffffff68,args_1);
  Trivia::Trivia(&local_10,Directive,(SyntaxNode *)syntax);
  return local_10;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedDriveStrength, loc);
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, loc);
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}